

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::UniformLocNegativeLinkMaxLocation::Run
          (UniformLocNegativeLinkMaxLocation *this)

{
  long lVar1;
  DefOccurence local_2c8;
  DefOccurence local_2c4;
  LayoutSpecifierBase local_2c0;
  LayoutSpecifierBase local_2b0;
  UniformType local_298;
  Uniform local_208;
  undefined1 local_30 [8];
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  GLint max;
  UniformLocNegativeLinkMaxLocation *this_local;
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x826e,
             (GLint *)((long)&uniforms.
                              super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
            *)local_30);
  UniformType::UniformType(&local_298,0x8b52,0);
  local_2c0 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C
                        (uniforms.
                         super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,Dec);
  local_2b0 = local_2c0;
  DefOccurence::DefOccurence(&local_2c4,FSH_OR_CSH);
  DefOccurence::DefOccurence(&local_2c8,ALL_SH);
  anon_unknown_0::Uniform::Uniform
            (&local_208,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_298,(Loc)local_2b0,local_2c4,local_2c8);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_30,&local_208);
  anon_unknown_0::Uniform::~Uniform(&local_208);
  UniformType::~UniformType(&local_298);
  lVar1 = ExplicitUniformLocationCaseBase::doRunNegativeLink
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)local_30);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
             *)local_30);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//layout (location = X) uniform float u0;
		//Where X is substituted with value of GL_MAX_UNIFORM_LOCATIONS.

		GLint max;
		glGetIntegerv(GL_MAX_UNIFORM_LOCATIONS, &max);

		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC4, Loc::C(max), DefOccurence::FSH_OR_CSH));

		return doRunNegativeLink(uniforms);
	}